

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cpp
# Opt level: O3

Pair<char32_t,_unsigned_long> __thiscall
Corrade::Utility::Unicode::nextChar(Unicode *this,StringView text,size_t cursor)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  ostream *output;
  Debug *pDVar4;
  ulong value;
  uint uVar5;
  long lVar6;
  ulong value_00;
  Pair<char32_t,_unsigned_long> PVar7;
  BasicStringView<const_char> local_70;
  ulong local_60;
  Error local_58;
  
  value = text._sizePlusFlags;
  local_70._sizePlusFlags = (size_t)text._data;
  value_00 = local_70._sizePlusFlags & 0x3fffffffffffffff;
  local_70._data = (char *)this;
  if (value_00 <= value) {
    output = Error::defaultOutput();
    Error::Error(&local_58,output,(Flags)0x0);
    pDVar4 = Debug::operator<<(&local_58.super_Debug,
                               "Utility::Unicode::nextChar(): expected cursor to be less than");
    pDVar4 = Debug::operator<<(pDVar4,value_00);
    pDVar4 = Debug::operator<<(pDVar4,"but got");
    Debug::operator<<(pDVar4,value);
    Error::~Error(&local_58);
    abort();
  }
  pbVar3 = (byte *)Containers::BasicStringView<const_char>::operator[](&local_70,value);
  bVar1 = *pbVar3;
  uVar2 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if ((uVar2 & 0xffffffe0) == 0xc0) {
      uVar5 = 0x1f;
      lVar6 = 2;
      goto LAB_0014122d;
    }
    if ((uVar2 & 0xfffffff0) == 0xe0) {
      uVar5 = 0xf;
      lVar6 = 3;
      goto LAB_0014122d;
    }
    if ((uVar2 & 0xfffffff8) == 0xf0) {
      uVar5 = 7;
      lVar6 = 4;
      goto LAB_0014122d;
    }
  }
  else {
    uVar5 = 0x7f;
    lVar6 = 1;
LAB_0014122d:
    local_60 = lVar6 + value;
    if (local_60 <= (local_70._sizePlusFlags & 0x3fffffffffffffff)) {
      uVar5 = uVar5 & uVar2;
      if (-1 < (char)bVar1) goto LAB_00141299;
      Containers::BasicStringView<const_char>::operator[](&local_70,value + 1);
    }
  }
  uVar5 = 0xffffffff;
LAB_00141299:
  PVar7._4_4_ = 0;
  PVar7._first = uVar5;
  PVar7._second = value + 1;
  return PVar7;
}

Assistant:

Containers::Pair<char32_t, std::size_t> nextChar(const Containers::StringView text, const std::size_t cursor) {
    CORRADE_DEBUG_ASSERT(cursor < text.size(),
        "Utility::Unicode::nextChar(): expected cursor to be less than" << text.size() << "but got" << cursor, {});

    std::uint32_t character = text[cursor];
    std::size_t end = cursor;
    std::uint32_t mask;

    /** @todo assert for overlong sequences */

    /* Sequence size */
    if(character < 0x80) {
        end += 1;
        mask = 0x7f;
    } else if((character & 0xe0) == 0xc0) {
        end += 2;
        mask = 0x1f;
    } else if((character & 0xf0) == 0xe0) {
        end += 3;
        mask = 0x0f;
    } else if((character & 0xf8) == 0xf0) {
        end += 4;
        mask = 0x07;

    /* Wrong sequence start */
    } else return {U'\xffffffff', cursor+1};

    /* Unexpected end */
    if(text.size() < end) return {U'\xffffffff', cursor+1};

    /* Compute the codepoint */
    char32_t result = character & mask;
    for(std::size_t i = cursor + 1; i != end; ++i) {
        /* Garbage in the sequence */
        if((text[i] & 0xc0) != 0x80)
            return {U'\xffffffff', cursor+1};

        result <<= 6;
        result |= (text[i] & 0x3f);
    }

    return {result, end};
}